

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileConstant(jx9_gen_state *pGen)

{
  sxu32 nLine_00;
  SyToken *pName_00;
  sxi32 sVar1;
  int iVar2;
  SySet *pSet;
  SySet *pContainer;
  bool bVar3;
  sxi32 rc;
  SyString *pName;
  sxu32 nLine;
  SySet *pInstrContainer;
  SySet *pConsCode;
  jx9_gen_state *pGen_local;
  
  nLine_00 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x600c) != 0)) {
    pName_00 = pGen->pIn;
    iVar2 = GenStateIsReservedID(&pName_00->sData);
    if (iVar2 == 0) {
      pGen->pIn = pGen->pIn + 1;
      if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x400000) != 0)) {
        pGen->pIn = pGen->pIn + 1;
        pSet = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x28);
        if (pSet == (SySet *)0x0) {
          sVar1 = GenStateOutOfMem(pGen);
          return sVar1;
        }
        SySetInit(pSet,&pGen->pVm->sAllocator,0x18);
        pContainer = jx9VmGetByteCodeContainer(pGen->pVm);
        jx9VmSetByteCodeContainer(pGen->pVm,pSet);
        sVar1 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar1 != -3),0,(void *)0x0,(sxu32 *)0x0);
        jx9VmSetByteCodeContainer(pGen->pVm,pContainer);
        if (sVar1 == -10) {
          return -10;
        }
        pSet->pUserData = pGen->pVm;
        sVar1 = jx9VmRegisterConstant(pGen->pVm,&pName_00->sData,jx9VmExpandConstantValue,pSet);
        if (sVar1 != 0) {
          SySetRelease(pSet);
          SyMemBackendPoolFree(&pGen->pVm->sAllocator,pSet);
        }
        return 0;
      }
      sVar1 = jx9GenCompileError(pGen,1,nLine_00,"const: Expected \'=\' after constant name");
      if (sVar1 == -10) {
        return -10;
      }
    }
    else {
      sVar1 = jx9GenCompileError(pGen,1,nLine_00,
                                 "const: Cannot redeclare a reserved constant \'%z\'",pName_00);
      if (sVar1 == -10) {
        return -10;
      }
    }
  }
  else {
    sVar1 = jx9GenCompileError(pGen,1,nLine_00,"const: Invalid constant name");
    if (sVar1 == -10) {
      return -10;
    }
  }
  while( true ) {
    bVar3 = false;
    if (pGen->pIn < pGen->pEnd) {
      bVar3 = (pGen->pIn->nType & 0x40000) == 0;
    }
    if (!bVar3) break;
    pGen->pIn = pGen->pIn + 1;
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileConstant(jx9_gen_state *pGen)
{
	SySet *pConsCode, *pInstrContainer;
	sxu32 nLine = pGen->pIn->nLine;
	SyString *pName;
	sxi32 rc;
	pGen->pIn++; /* Jump the 'const' keyword */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_SSTR|JX9_TK_DSTR|JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid constant name */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Invalid constant name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Peek constant name */
	pName = &pGen->pIn->sData;
	/* Make sure the constant name isn't reserved */
	if( GenStateIsReservedID(pName) ){
		/* Reserved constant */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Cannot redeclare a reserved constant '%z'", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	pGen->pIn++;
	if(pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_EQUAL /* '=' */) == 0 ){
		/* Invalid statement*/
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "const: Expected '=' after constant name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	pGen->pIn++; /*Jump the equal sign */
	/* Allocate a new constant value container */
	pConsCode = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(SySet));
	if( pConsCode == 0 ){
		return GenStateOutOfMem(pGen);
	}
	SySetInit(pConsCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
	/* Swap bytecode container */
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, pConsCode);
	/* Compile constant value */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	if( rc == SXERR_ABORT ){
		/* Don't worry about freeing memory, everything will be released shortly */
		return SXERR_ABORT;
	}
	SySetSetUserData(pConsCode, pGen->pVm);
	/* Register the constant */
	rc = jx9VmRegisterConstant(pGen->pVm, pName, jx9VmExpandConstantValue, pConsCode);
	if( rc != SXRET_OK ){
		SySetRelease(pConsCode);
		SyMemBackendPoolFree(&pGen->pVm->sAllocator, pConsCode);
	}
	return SXRET_OK;
Synchronize:
	/* Synchronize with the next-semi-colon and avoid compiling this erroneous statement */
	while(pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}